

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routing_table.cpp
# Opt level: O3

add_node_status_t
libtorrent::dht::replace_node_impl
          (node_entry *e,bucket_t *b,ip_set *ips,int bucket_index,int bucket_size_limit,
          bool last_bucket,dht_logger *log)

{
  pointer *pp_Var1;
  node_id *this;
  ushort uVar2;
  pointer pnVar3;
  iterator __position;
  void *pvVar4;
  rep rVar5;
  rep rVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  pointer p_Var12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  undefined4 uVar16;
  int iVar17;
  __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
  __result;
  node_entry *pnVar18;
  pointer p_Var19;
  __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
  _Var20;
  char *pcVar21;
  pointer pnVar22;
  difference_type extraout_RDX;
  difference_type extraout_RDX_00;
  difference_type extraout_RDX_01;
  difference_type dVar23;
  pointer p_Var24;
  difference_type extraout_RDX_02;
  add_node_status_t aVar25;
  int iVar26;
  int n;
  byte bVar27;
  pointer pnVar28;
  byte bVar29;
  char *pcVar30;
  long lVar31;
  bool bVar32;
  span<const_unsigned_int> buf;
  span<const_unsigned_int> buf_00;
  span<const_unsigned_int> buf_01;
  span<const_unsigned_int> buf_02;
  span<const_char> in;
  __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
  local_d40;
  node_entry *local_d38;
  bucket_t *local_d30;
  vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
  replace_candidates;
  int local_ce4;
  ulong local_ce0;
  string local_cd8;
  uint local_cb8 [2];
  uint auStack_cb0 [2];
  uint local_ca8;
  digest32<160L> local_c98;
  pointer local_c78;
  pointer p_Stack_c70;
  uint local_c68;
  uint local_c58;
  undefined4 local_c54;
  long local_c50 [3];
  array<std::vector<bucket_t::iterator>,_128> nodes_storage;
  
  local_d40._M_current =
       (b->super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>).
       super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pnVar3 = (b->
           super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>).
           super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pnVar22 = local_d40._M_current + 1;
  if (pnVar22 != pnVar3 && local_d40._M_current != pnVar3) {
    do {
      bVar27 = 0;
      if ((local_d40._M_current)->timeout_count != 0xff) {
        bVar27 = (local_d40._M_current)->timeout_count;
      }
      pnVar28 = pnVar22;
      if (pnVar22->timeout_count <= bVar27) {
        pnVar28 = local_d40._M_current;
      }
      if (pnVar22->timeout_count != 0xff) {
        local_d40._M_current = pnVar28;
      }
      pnVar22 = pnVar22 + 1;
    } while (pnVar22 != pnVar3);
  }
  local_d30 = b;
  if (1 < (byte)((local_d40._M_current)->timeout_count + 1)) {
    bVar32 = (((local_d40._M_current)->endpoint).addr.field_0x10 & 1) == 0;
    if (bVar32) {
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           *(pointer *)&((local_d40._M_current)->endpoint).addr.addr;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           *(pointer *)((long)&((local_d40._M_current)->endpoint).addr.addr + 8);
      uVar16 = 0;
    }
    else {
      uVar16 = *(undefined4 *)((local_d40._M_current)->endpoint).addr.addr.v4._M_elems;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    nodes_storage.
    super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
    ._M_elems[1].
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    nodes_storage.
    super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
    ._M_elems[0].
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar16,(uint)bVar32);
    ip_set::erase(ips,(address *)&nodes_storage);
    rVar5 = (e->first_seen).__d.__r;
    rVar6 = (e->last_queried).__d.__r;
    uVar7 = *(undefined8 *)(e->id).m_number._M_elems;
    uVar8 = *(undefined8 *)((e->id).m_number._M_elems + 2);
    uVar9 = *(undefined8 *)((e->id).m_number._M_elems + 4);
    uVar10 = *(undefined8 *)((long)&(e->endpoint).addr.addr + 4);
    uVar11 = *(undefined8 *)&(e->endpoint).addr.field_0x10;
    *(undefined8 *)((long)&((local_d40._M_current)->endpoint).addr.addr + 8) =
         *(undefined8 *)((long)&(e->endpoint).addr.addr + 8);
    *(undefined8 *)&((local_d40._M_current)->endpoint).addr.field_0x10 = uVar11;
    *(undefined8 *)(((local_d40._M_current)->id).m_number._M_elems + 4) = uVar9;
    *(undefined8 *)((long)&((local_d40._M_current)->endpoint).addr.addr + 4) = uVar10;
    *(undefined8 *)((local_d40._M_current)->id).m_number._M_elems = uVar7;
    *(undefined8 *)(((local_d40._M_current)->id).m_number._M_elems + 2) = uVar8;
    ((local_d40._M_current)->first_seen).__d.__r = rVar5;
    ((local_d40._M_current)->last_queried).__d.__r = rVar6;
    bVar32 = ((e->endpoint).addr.field_0x10 & 1) == 0;
    if (bVar32) {
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)&(e->endpoint).addr.addr;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           *(pointer *)((long)&(e->endpoint).addr.addr + 8);
      uVar16 = 0;
    }
    else {
      uVar16 = *(undefined4 *)(e->endpoint).addr.addr.v4._M_elems;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    nodes_storage.
    super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
    ._M_elems[1].
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    nodes_storage.
    super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
    ._M_elems[0].
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar16,(uint)bVar32);
    ip_set::insert(ips,(address *)&nodes_storage);
    return node_added;
  }
  nodes_storage.
  super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
  ._M_elems[0].
  super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(nodes_storage.
                         super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
                         ._M_elems[0].
                         super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                         (e->id).m_number._M_elems[4]);
  nodes_storage.
  super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
  ._M_elems[0].
  super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(e->id).m_number._M_elems;
  nodes_storage.
  super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
  ._M_elems[0].
  super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)((e->id).m_number._M_elems + 2);
  iVar26 = bucket_size_limit + -1;
  replace_candidates.
  super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(replace_candidates.
                         super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar26);
  buf.m_len = (difference_type)pnVar22;
  buf.m_ptr = (uint *)0x1;
  local_d38 = e;
  iVar13 = aux::count_leading_zeros((aux *)&replace_candidates,buf);
  n = (last_bucket ^ 1) + bucket_index;
  digest32<160L>::operator<<=((digest32<160L> *)&nodes_storage,n);
  uVar14 = ((uint)(byte)nodes_storage.
                        super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
                        ._M_elems[0].
                        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & iVar26 << ((byte)iVar13 & 0x1f))
           >> ((byte)iVar13 & 0x1f);
  memset(&nodes_storage,0,0xc00);
  local_d40._M_current =
       (local_d30->
       super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>).
       super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pnVar18 = (local_d30->
            super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>)
            .
            super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_d40._M_current != pnVar18) {
    dVar23 = extraout_RDX;
    do {
      local_c68 = ((local_d40._M_current)->id).m_number._M_elems[4];
      replace_candidates.
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           *(pointer *)((local_d40._M_current)->id).m_number._M_elems;
      replace_candidates.
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           *(pointer *)(((local_d40._M_current)->id).m_number._M_elems + 2);
      replace_candidates.
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(replace_candidates.
                             super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,local_c68);
      buf_00.m_len = dVar23;
      buf_00.m_ptr = (uint *)0x1;
      local_cd8._M_dataplus._M_p._0_4_ = iVar26;
      local_c78 = replace_candidates.
                  super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      p_Stack_c70 = replace_candidates.
                    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      iVar13 = aux::count_leading_zeros((aux *)&local_cd8,buf_00);
      digest32<160L>::operator<<=((digest32<160L> *)&replace_candidates,n);
      uVar15 = ((uint)(byte)replace_candidates.
                            super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start &
               iVar26 << ((byte)iVar13 & 0x1f)) >> ((byte)iVar13 & 0x1f);
      __position._M_current =
           nodes_storage.
           super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
           ._M_elems[uVar15].
           super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          nodes_storage.
          super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
          ._M_elems[uVar15].
          super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>
        ::
        _M_realloc_insert<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>const&>
                  ((vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>
                    *)&nodes_storage.
                       super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
                       ._M_elems[uVar15].
                       super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                   ,__position,&local_d40);
        dVar23 = extraout_RDX_01;
      }
      else {
        (__position._M_current)->_M_current = local_d40._M_current;
        pp_Var1 = &nodes_storage.
                   super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
                   ._M_elems[uVar15].
                   super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
        dVar23 = extraout_RDX_00;
      }
      local_d40._M_current = local_d40._M_current + 1;
      pnVar18 = (local_d30->
                super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                ).
                super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (local_d40._M_current != pnVar18);
  }
  p_Var19 = nodes_storage.
            super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
            ._M_elems[uVar14].
            super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var24 = nodes_storage.
            super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
            ._M_elems[uVar14].
            super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  p_Var12 = p_Var19;
  if (p_Var19 == p_Var24) {
    replace_candidates.
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    replace_candidates.
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    replace_candidates.
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar31 = 0;
    do {
      if (8 < (ulong)(*(long *)((long)&nodes_storage.
                                       super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
                                       ._M_elems[0].
                                       super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + lVar31) -
                     *(long *)((long)&nodes_storage.
                                      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
                                      ._M_elems[0].
                                      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar31))) {
        ::std::
        vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>const*,std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>>>
                  ((vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>
                    *)&replace_candidates,
                   replace_candidates.
                   super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      lVar31 = lVar31 + 0x18;
    } while ((long)bucket_size_limit * 0x18 != lVar31);
    p_Var19 = replace_candidates.
              super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1;
    p_Var24 = replace_candidates.
              super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (p_Var19 !=
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish &&
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar27 = p_Var24->_M_current->verified ^ 1;
        bVar29 = p_Var19->_M_current->verified ^ 1;
        if ((bVar27 < bVar29) ||
           ((bVar27 <= bVar29 && (p_Var24->_M_current->rtt < p_Var19->_M_current->rtt)))) {
          p_Var24 = p_Var19;
        }
        p_Var19 = p_Var19 + 1;
      } while (p_Var19 !=
               replace_candidates.
               super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_d40._M_current = p_Var24->_M_current;
    if (replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(replace_candidates.
                      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)replace_candidates.
                            super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)replace_candidates.
                            super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pnVar18 = (local_d30->
              super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
              ).
              super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
LAB_003c05b9:
    _Var20._M_current = local_d40._M_current;
    if (local_d40._M_current != pnVar18) {
      if ((log != (dht_logger *)0x0) &&
         (iVar13 = (**log->_vptr_dht_logger)(log,2), pnVar18 = local_d38, (char)iVar13 != '\0')) {
        this = &local_d38->id;
        in.m_len = (difference_type)_Var20._M_current;
        in.m_ptr = (char *)0x14;
        aux::to_hex_abi_cxx11_((string *)&replace_candidates,(aux *)this,in);
        bVar32 = ((pnVar18->endpoint).addr.field_0x10 & 1) == 0;
        if (bVar32) {
          local_c50[0] = *(long *)&(pnVar18->endpoint).addr.addr;
          local_c50[1] = *(undefined8 *)((long)&(pnVar18->endpoint).addr.addr + 8);
          local_c54 = 0;
        }
        else {
          local_c54 = *(undefined4 *)(pnVar18->endpoint).addr.addr.v4._M_elems;
          local_c50[0] = 0;
          local_c50[1] = 0;
        }
        local_c50[2] = 0;
        local_c58 = (uint)bVar32;
        local_d30 = (bucket_t *)
                    replace_candidates.
                    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        aux::print_address_abi_cxx11_
                  (&local_cd8,(aux *)&local_c58,
                   (address *)
                   replace_candidates.
                   super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        pcVar30 = "not-verified";
        pcVar21 = "not-verified";
        if (local_d38->verified != false) {
          pcVar21 = "verified";
        }
        uVar7 = CONCAT44(local_cd8._M_dataplus._M_p._4_4_,(int)local_cd8._M_dataplus._M_p);
        uVar2 = local_d38->rtt;
        local_c98.m_number._M_elems[4] = (pnVar18->id).m_number._M_elems[4];
        local_c98.m_number._M_elems._0_8_ = *(undefined8 *)(this->m_number)._M_elems;
        local_c98.m_number._M_elems._8_8_ = *(undefined8 *)((pnVar18->id).m_number._M_elems + 2);
        buf_01.m_len = (difference_type)"verified";
        buf_01.m_ptr = (uint *)0x1;
        local_ce4 = iVar26;
        iVar13 = aux::count_leading_zeros((aux *)&local_ce4,buf_01);
        digest32<160L>::operator<<=(&local_c98,n);
        uVar14 = (uint)(byte)local_c98.m_number._M_elems[0];
        bVar32 = (local_d40._M_current)->verified;
        local_ce0 = (ulong)(local_d40._M_current)->rtt;
        local_ca8 = ((local_d40._M_current)->id).m_number._M_elems[4];
        local_cb8 = *(uint (*) [2])((local_d40._M_current)->id).m_number._M_elems;
        auStack_cb0 = *(uint (*) [2])(((local_d40._M_current)->id).m_number._M_elems + 2);
        buf_02.m_len = extraout_RDX_02;
        buf_02.m_ptr = (uint *)0x1;
        local_ce4 = iVar26;
        local_c98.m_number._M_elems._0_8_ = local_cb8;
        local_c98.m_number._M_elems._8_8_ = auStack_cb0;
        local_c98.m_number._M_elems[4] = local_ca8;
        iVar17 = aux::count_leading_zeros((aux *)&local_ce4,buf_02);
        digest32<160L>::operator<<=(&local_c98,n);
        if (bVar32 != false) {
          pcVar30 = "verified";
        }
        (*log->_vptr_dht_logger[1])
                  (log,2,"replacing node with better one: %s %s [%s %dms %d] vs. [%s %dms %d]",
                   local_d30,uVar7,pcVar21,(ulong)uVar2,
                   (ulong)((iVar26 << ((byte)iVar13 & 0x1f) & uVar14) >> ((byte)iVar13 & 0x1f)),
                   pcVar30,local_ce0,
                   (ulong)(((uint)(byte)local_c98.m_number._M_elems[0] &
                           iVar26 << ((byte)iVar17 & 0x1f)) >> ((byte)iVar17 & 0x1f)));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_cd8._M_dataplus._M_p._4_4_,(int)local_cd8._M_dataplus._M_p) !=
            &local_cd8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_cd8._M_dataplus._M_p._4_4_,(int)local_cd8._M_dataplus._M_p)
                          ,local_cd8.field_2._M_allocated_capacity + 1);
        }
        if (replace_candidates.
            super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&replace_candidates.
                      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(replace_candidates.
                          super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&(replace_candidates.
                                          super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_current + 1));
        }
      }
      bVar32 = (((local_d40._M_current)->endpoint).addr.field_0x10 & 1) == 0;
      if (bVar32) {
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)&((local_d40._M_current)->endpoint).addr.addr;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((long)&((local_d40._M_current)->endpoint).addr.addr + 8);
        uVar16 = 0;
      }
      else {
        uVar16 = *(undefined4 *)((local_d40._M_current)->endpoint).addr.addr.v4._M_elems;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      replace_candidates.
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar16,(uint)bVar32);
      ip_set::erase(ips,(address *)&replace_candidates);
      rVar5 = (local_d38->first_seen).__d.__r;
      rVar6 = (local_d38->last_queried).__d.__r;
      uVar7 = *(undefined8 *)(local_d38->id).m_number._M_elems;
      uVar8 = *(undefined8 *)((local_d38->id).m_number._M_elems + 2);
      uVar9 = *(undefined8 *)((local_d38->id).m_number._M_elems + 4);
      uVar10 = *(undefined8 *)((long)&(local_d38->endpoint).addr.addr + 4);
      uVar11 = *(undefined8 *)&(local_d38->endpoint).addr.field_0x10;
      *(undefined8 *)((long)&((local_d40._M_current)->endpoint).addr.addr + 8) =
           *(undefined8 *)((long)&(local_d38->endpoint).addr.addr + 8);
      *(undefined8 *)&((local_d40._M_current)->endpoint).addr.field_0x10 = uVar11;
      *(undefined8 *)(((local_d40._M_current)->id).m_number._M_elems + 4) = uVar9;
      *(undefined8 *)((long)&((local_d40._M_current)->endpoint).addr.addr + 4) = uVar10;
      *(undefined8 *)((local_d40._M_current)->id).m_number._M_elems = uVar7;
      *(undefined8 *)(((local_d40._M_current)->id).m_number._M_elems + 2) = uVar8;
      ((local_d40._M_current)->first_seen).__d.__r = rVar5;
      ((local_d40._M_current)->last_queried).__d.__r = rVar6;
      bVar32 = ((local_d38->endpoint).addr.field_0x10 & 1) == 0;
      if (bVar32) {
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)&(local_d38->endpoint).addr.addr;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((long)&(local_d38->endpoint).addr.addr + 8);
        uVar16 = 0;
      }
      else {
        uVar16 = *(undefined4 *)(local_d38->endpoint).addr.addr.v4._M_elems;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      replace_candidates.
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar16,(uint)bVar32);
      ip_set::insert(ips,(address *)&replace_candidates);
      aVar25 = node_added;
      goto LAB_003c08bf;
    }
  }
  else {
    while (p_Var19 = p_Var19 + 1, p_Var19 != p_Var24) {
      bVar27 = p_Var12->_M_current->verified ^ 1;
      bVar29 = p_Var19->_M_current->verified ^ 1;
      if ((bVar27 < bVar29) ||
         ((bVar27 <= bVar29 && (p_Var12->_M_current->rtt < p_Var19->_M_current->rtt)))) {
        p_Var12 = p_Var19;
      }
    }
    local_d40._M_current = p_Var12->_M_current;
    bVar27 = local_d38->verified ^ 1;
    bVar29 = (local_d40._M_current)->verified ^ 1;
    if ((bVar27 < bVar29) ||
       ((_Var20._M_current = pnVar18, bVar27 <= bVar29 &&
        (local_d38->rtt < (local_d40._M_current)->rtt)))) goto LAB_003c05b9;
  }
  local_d40._M_current = _Var20._M_current;
  aVar25 = need_bucket_split;
LAB_003c08bf:
  lVar31 = 0xc00;
  do {
    pvVar4 = *(void **)((long)local_c50 + lVar31);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,*(long *)((long)nodes_storage.
                                             super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
                                             ._M_elems + lVar31 + -8) - (long)pvVar4);
    }
    lVar31 = lVar31 + -0x18;
  } while (lVar31 != 0);
  return aVar25;
}

Assistant:

routing_table::add_node_status_t replace_node_impl(node_entry const& e
	, bucket_t& b, ip_set& ips, int const bucket_index
	, int const bucket_size_limit, bool const last_bucket
#ifndef TORRENT_DISABLE_LOGGING
	, dht_logger* log
#endif
	)
{
	// if the bucket isn't full, we're not replacing anything, and this function
	// should not have been called
	TORRENT_ASSERT(int(b.size()) >= bucket_size_limit);

	auto j = std::max_element(b.begin(), b.end()
		, [](node_entry const& lhs, node_entry const& rhs)
		{ return lhs.fail_count() < rhs.fail_count(); });
	TORRENT_ASSERT(j != b.end());

	if (j->fail_count() > 0)
	{
		// i points to a node that has been marked
		// as stale. Replace it with this new one
		ips.erase(j->addr());
		*j = e;
		ips.insert(e.addr());
		return routing_table::node_added;
	}

	// then we look for nodes with the same 3 bit prefix (or however
	// many bits prefix the bucket size warrants). If there is no other
	// node with this prefix, remove the duplicate with the highest RTT.
	// as the last replacement strategy, if the node we found matching our
	// bit prefix has higher RTT than the new node, replace it.

	// in order to provide as few lookups as possible before finding
	// the data someone is looking for, make sure there is an affinity
	// towards having a good spread of node IDs in each bucket
	std::uint8_t const to_add_prefix = classify_prefix(bucket_index
		, last_bucket, bucket_size_limit, e.id);

	// nodes organized by their prefix
	aux::array<std::vector<bucket_t::iterator>, 128> nodes_storage;
	auto const nodes = span<std::vector<bucket_t::iterator>>{nodes_storage}.first(bucket_size_limit);

	for (j = b.begin(); j != b.end(); ++j)
	{
		std::uint8_t const prefix = classify_prefix(
			bucket_index, last_bucket, bucket_size_limit, j->id);
		TORRENT_ASSERT(prefix < nodes.size());
		nodes[prefix].push_back(j);
	}

	if (!nodes[to_add_prefix].empty())
	{
		j = *std::max_element(nodes[to_add_prefix].begin(), nodes[to_add_prefix].end()
			, [](bucket_t::iterator lhs, bucket_t::iterator rhs)
			{ return *lhs < *rhs; });

		// only if e is better than the worst node in this prefix slot do we
		// replace it. resetting j means we're not replacing it
		if (!(e < *j)) j = b.end();
	}
	else
	{
		// there is no node in this prefix slot. We definitely want to add it.
		// Now we just need to figure out which one to replace
		std::vector<bucket_t::iterator> replace_candidates;
		for (auto const& n : nodes)
		{
			if (n.size() > 1) replace_candidates.insert(replace_candidates.end(), n.begin(), n.end());
		}

		// since the bucket is full, and there's no node in the prefix-slot
		// we're about to add to, there must be at least one prefix slot that
		// has more than one node.
		TORRENT_ASSERT(!replace_candidates.empty());

		// from these nodes, pick the "worst" one and replace it
		j = *std::max_element(replace_candidates.begin(), replace_candidates.end()
			, [](bucket_t::iterator lhs, bucket_t::iterator rhs)
			{ return *lhs < *rhs; });
	}

	if (j != b.end())
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (log != nullptr && log->should_log(dht_logger::routing_table))
		{
			log->log(dht_logger::routing_table, "replacing node with better one: %s %s [%s %dms %d] vs. [%s %dms %d]"
				, aux::to_hex(e.id).c_str(), aux::print_address(e.addr()).c_str()
				, e.verified ? "verified" : "not-verified", e.rtt
				, classify_prefix(bucket_index, last_bucket, bucket_size_limit, e.id)
				, j->verified ? "verified" : "not-verified", j->rtt
				, classify_prefix(bucket_index, last_bucket, bucket_size_limit, j->id)
				);
		}
#endif
		ips.erase(j->addr());
		*j = e;
		ips.insert(e.addr());
		return routing_table::node_added;
	}
	return routing_table::need_bucket_split;
}